

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

void __thiscall helics::apps::WebServer::processArgs(WebServer *this,string_view args)

{
  Option *pOVar1;
  App *pAVar2;
  Option *pOVar3;
  long lVar4;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  allocator<char> local_9cb;
  allocator<char> local_9ca;
  allocator<char> local_9c9;
  string local_9c8;
  Validator local_9a8;
  string_view args_local;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d0 [4];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  Validator local_3f0;
  App parser;
  
  args_local._M_str = args._M_str;
  args_local._M_len = args._M_len;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"http web server parser",(allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,"",(allocator<char> *)&local_9a8);
  CLI::App::App(&parser,&local_5f0,&local_610);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_5f0);
  parser.allow_extras_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"--http_port",(allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"specify the http port to use",(allocator<char> *)&local_9a8);
  pOVar1 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (&parser,&local_630,&this->mHttpPort,&local_650);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"HELICS_HTTP_PORT",(allocator<char> *)&local_9c8);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar1->envname_,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"--http_interface",(allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,
             "specify the interface for the http server to listen on for connections",
             (allocator<char> *)&local_9a8);
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&parser,&local_670,&this->mHttpAddress,&local_690);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"HELICS_HTTP_ADDRESS",(allocator<char> *)&local_9c8);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar1->envname_,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"http",(allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"",(allocator<char> *)&local_9a8);
  pAVar2 = CLI::App::add_subcommand(&parser,&local_6b0,&local_6d0);
  pAVar2->fallthrough_ = true;
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f0,"--port",(allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_710,"specify the http port to use",(allocator<char> *)&local_9a8);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar2,&local_6f0,&this->mHttpPort,&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"--interface",(allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,
             "specify the interface for the http server to listen on for connections",
             (allocator<char> *)&local_9a8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_730,&this->mHttpAddress,&local_750);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"--websocket_port",(allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"specify the websocket port to use",(allocator<char> *)&local_9a8)
  ;
  pOVar1 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (&parser,&local_770,&this->mWebsocketPort,&local_790);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"HELICS_WEBSOCKET_PORT",(allocator<char> *)&local_9c8);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar1->envname_,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"--websocket_interface",(allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d0,
             "specify the interface for the websocket server to listen on for connections",
             (allocator<char> *)&local_9a8);
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&parser,&local_7b0,&this->mWebsocketAddress,&local_7d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"HELICS_WEBSOCKET_ADDRESS",(allocator<char> *)&local_9c8);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar1->envname_,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"websocket",(allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_810,"",(allocator<char> *)&local_9a8);
  pAVar2 = CLI::App::add_subcommand(&parser,&local_7f0,&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_830,"--port",(allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_850,"specify the websocket port to use",(allocator<char> *)&local_9a8)
  ;
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar2,&local_830,&this->mWebsocketPort,&local_850);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_830);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_870,"--interface",(allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_890,
             "specify the interface for the websocket server to listen on for connections",
             (allocator<char> *)&local_9a8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_870,&this->mWebsocketAddress,&local_890);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,"--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}",
             (allocator<char> *)local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d0,"specify external interface to use, default is --local",
             (allocator<char> *)&local_9a8);
  pOVar1 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>
                     (&parser,&local_8b0,&this->mInterfaceNetwork,&local_8d0);
  (pOVar1->super_OptionBase<CLI::Option>).disable_flag_override_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"HELICS_WEBSERVER_INTERFACE",(allocator<char> *)&local_9c8);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar1->envname_,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f0,"--network_connectivity",&local_9c9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_910,"specify the connectivity of the network interface",&local_9ca);
  pOVar3 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (&parser,&local_8f0,&this->mInterfaceNetwork,&local_910);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[2],_true>
            (local_5d0,(char (*) [6])0x37a821,(char (*) [2])0x3b2463);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (local_5d0 + 1,(char (*) [5])"ipv4",(char (*) [2])0x3ac078);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (local_5d0 + 2,(char (*) [5])"ipv6",(char (*) [2])0x3b5a89);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[3],_true>
            (local_5d0 + 3,(char (*) [9])"external",(char (*) [3])0x3ac3f9);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (&local_4d0,(char (*) [4])0x3a73a9,(char (*) [3])0x3ac3f9);
  values._M_len = 5;
  values._M_array = local_5d0;
  CLI::CheckedTransformer::CheckedTransformer<>((CheckedTransformer *)&local_9a8,values);
  CLI::Validator::Validator(&local_3f0,&local_9a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,"",&local_9cb);
  pOVar3 = CLI::Option::transform(pOVar3,&local_3f0,&local_9c8);
  CLI::Option::excludes(pOVar3,pOVar1);
  std::__cxx11::string::~string((string *)&local_9c8);
  CLI::Validator::~Validator(&local_3f0);
  CLI::Validator::~Validator(&local_9a8);
  lVar4 = 0x100;
  do {
    CLI::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_5d0[0].first._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_930,&args_local,(allocator<char> *)local_5d0);
  CLI::App::parse(&parser,&local_930,false);
  std::__cxx11::string::~string((string *)&local_930);
  CLI::App::~App(&parser);
  return;
}

Assistant:

void WebServer::processArgs(std::string_view args)

{
    CLI::App parser("http web server parser");
    parser.allow_extras();
    parser.add_option("--http_port", mHttpPort, "specify the http port to use")
        ->envname("HELICS_HTTP_PORT");
    parser
        .add_option("--http_interface",
                    mHttpAddress,
                    "specify the interface for the http server to listen on for connections")
        ->envname("HELICS_HTTP_ADDRESS");
    auto* httpsub = parser.add_subcommand("http")->fallthrough();
    httpsub->add_option("--port", mHttpPort, "specify the http port to use");
    httpsub->add_option("--interface",
                        mHttpAddress,
                        "specify the interface for the http server to listen on for connections");

    parser.add_option("--websocket_port", mWebsocketPort, "specify the websocket port to use")
        ->envname("HELICS_WEBSOCKET_PORT");
    parser
        .add_option("--websocket_interface",
                    mWebsocketAddress,
                    "specify the interface for the websocket server to listen on for connections")
        ->envname("HELICS_WEBSOCKET_ADDRESS");

    auto* websub = parser.add_subcommand("websocket");
    websub->add_option("--port", mWebsocketPort, "specify the websocket port to use");
    websub->add_option(
        "--interface",
        mWebsocketAddress,
        "specify the interface for the websocket server to listen on for connections");
    auto* niflag = parser
                       .add_flag("--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}",
                                 mInterfaceNetwork,
                                 "specify external interface to use, default is --local")
                       ->disable_flag_override()
                       ->envname("HELICS_WEBSERVER_INTERFACE");

    parser
        .add_option("--network_connectivity",
                    mInterfaceNetwork,
                    "specify the connectivity of the network interface")
        ->transform(CLI::CheckedTransformer(
            {{"local", "0"}, {"ipv4", "4"}, {"ipv6", "6"}, {"external", "10"}, {"all", "10"}}))
        ->excludes(niflag);

    try {
        parser.parse(std::string(args));
    }
    catch (const CLI::Error& ce) {
        logMessage(std::string("error processing command line arguments for web server :") +
                   ce.what());
    }
}